

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uint zng_read_buf(zng_stream *strm,uchar *buf,uint size)

{
  uint32_t uVar1;
  uint in_EDX;
  uint8_t *in_RSI;
  long *in_RDI;
  uint32_t len;
  uint local_24;
  uint local_4;
  
  local_24 = in_EDX;
  if (*(uint *)(in_RDI + 1) <= in_EDX) {
    local_24 = *(uint *)(in_RDI + 1);
  }
  if (local_24 == 0) {
    local_4 = 0;
  }
  else {
    *(uint *)(in_RDI + 1) = (int)in_RDI[1] - local_24;
    if (*(int *)(in_RDI[7] + 0x20) == 2) {
      (*functable.crc32_fold_copy)
                ((crc32_fold_s *)(in_RDI[7] + 0xc0),in_RSI,(uint8_t *)*in_RDI,(size_t)local_24);
    }
    else if (*(int *)(in_RDI[7] + 0x20) == 1) {
      uVar1 = (*functable.adler32_fold_copy)
                        (*(uint32_t *)((long)in_RDI + 0x5c),in_RSI,(uint8_t *)*in_RDI,
                         (size_t)local_24);
      *(uint32_t *)((long)in_RDI + 0x5c) = uVar1;
    }
    else {
      memcpy(in_RSI,(void *)*in_RDI,(ulong)local_24);
    }
    *in_RDI = *in_RDI + (ulong)local_24;
    in_RDI[2] = (ulong)local_24 + in_RDI[2];
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

Z_INTERNAL unsigned PREFIX(read_buf)(PREFIX3(stream) *strm, unsigned char *buf, unsigned size) {
    uint32_t len = MIN(strm->avail_in, size);
    if (len == 0)
        return 0;

    strm->avail_in  -= len;

    if (!DEFLATE_NEED_CHECKSUM(strm)) {
        memcpy(buf, strm->next_in, len);
#ifdef GZIP
    } else if (strm->state->wrap == 2) {
        FUNCTABLE_CALL(crc32_fold_copy)(&strm->state->crc_fold, buf, strm->next_in, len);
#endif
    } else if (strm->state->wrap == 1) {
        strm->adler = FUNCTABLE_CALL(adler32_fold_copy)(strm->adler, buf, strm->next_in, len);
    } else {
        memcpy(buf, strm->next_in, len);
    }
    strm->next_in  += len;
    strm->total_in += len;

    return len;
}